

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O1

void __thiscall adios2::Engine::Put(Engine *this,VariableNT *variable,uint16_t *datum,Mode launch)

{
  Engine *pointer;
  VariableBase *pointer_00;
  string local_70;
  string local_50;
  
  pointer = this->m_Engine;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"in call to Engine::Put","");
  helper::CheckForNullptr<adios2::core::Engine>(pointer,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pointer_00 = variable->m_Variable;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"for variable in call to Engine::Put","");
  helper::CheckForNullptr<adios2::core::VariableBase>(pointer_00,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  adios2::core::Engine::Put<unsigned_short>
            ((Variable *)this->m_Engine,(ushort *)variable->m_Variable,(Mode)datum);
  return;
}

Assistant:

void Engine::Get(VariableNT &variable, void *data, const Mode launch)
{
    adios2::helper::CheckForNullptr(m_Engine, "in call to Engine::Get");
    adios2::helper::CheckForNullptr(variable.m_Variable, "for variable in call to Engine::Get");
#define declare_type(T)                                                                            \
    if (variable.m_Variable->m_Type == helper::GetDataType<T>())                                   \
    {                                                                                              \
        m_Engine->Get(*reinterpret_cast<core::Variable<T> *>(variable.m_Variable),                 \
                      reinterpret_cast<T *>(data), launch);                                        \
    }
    ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
    else if (variable.m_Variable->m_Type == DataType::Struct)
    {
        m_Engine->Get(*reinterpret_cast<core::VariableStruct *>(variable.m_Variable), data, launch);
    }
}